

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::StreamINstate(ChBody *this,ChStreamInBinary *mstream)

{
  ChCoordsys<double> *pCVar1;
  
  pCVar1 = &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord;
  ChStreamInBinary::operator>>(mstream,(double *)pCVar1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos.m_data + 1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.pos.m_data + 2);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.rot.m_data);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.rot.m_data + 1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.rot.m_data + 2);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                     coord.rot.m_data + 3);
  ChFrame<double>::SetCoord((ChFrame<double> *)&this->super_ChBodyFrame,pCVar1);
  pCVar1 = &(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt;
  ChStreamInBinary::operator>>(mstream,(double *)pCVar1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data + 1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data + 2);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data + 1);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data + 2);
  ChStreamInBinary::operator>>
            (mstream,(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data + 3);
  (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[6])
            (&this->super_ChBodyFrame,pCVar1);
  (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x14])(this,1);
  (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0xb])(this);
  return;
}

Assistant:

void ChBody::StreamINstate(ChStreamInBinary& mstream) {
    // Do not serialize parent classes and do not
    // implement versioning, because this must be efficient
    // and will be used just for domain decomposition.
    mstream >> this->coord.pos.x();
    mstream >> this->coord.pos.y();
    mstream >> this->coord.pos.z();
    mstream >> this->coord.rot.e0();
    mstream >> this->coord.rot.e1();
    mstream >> this->coord.rot.e2();
    mstream >> this->coord.rot.e3();
    this->SetCoord(coord);
    mstream >> this->coord_dt.pos.x();
    mstream >> this->coord_dt.pos.y();
    mstream >> this->coord_dt.pos.z();
    mstream >> this->coord_dt.rot.e0();
    mstream >> this->coord_dt.rot.e1();
    mstream >> this->coord_dt.rot.e2();
    mstream >> this->coord_dt.rot.e3();
    this->SetCoord_dt(coord_dt);

    this->Update();
    this->SyncCollisionModels();
}